

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

idx_t duckdb::SortKeyVarcharOperator::Decode
                (const_data_ptr_t input,Vector *result,idx_t result_idx,bool flip_bytes)

{
  uint *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  const_data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long lVar5;
  data_t dVar6;
  char cVar7;
  ulong uVar8;
  undefined7 in_register_00000009;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  undefined1 *puVar12;
  Vector *vector;
  anon_struct_16_3_d7536bce_for_pointer aVar13;
  
  pdVar4 = result->data;
  dVar6 = 0xff;
  if ((int)CONCAT71(in_register_00000009,flip_bytes) == 0) {
    dVar6 = '\0';
  }
  vector = (Vector *)0xffffffffffffffff;
  do {
    pdVar3 = input + 1 + (long)vector;
    vector = (Vector *)&vector->field_0x1;
  } while (dVar6 != *pdVar3);
  aVar13 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString((StringVector *)result,vector,result_idx);
  puVar1 = (uint *)(pdVar4 + result_idx * 0x10);
  paVar2 = (anon_union_16_2_67f50693_for_value *)(pdVar4 + result_idx * 0x10);
  pcVar10 = (paVar2->pointer).prefix;
  paVar2->pointer = aVar13;
  pcVar9 = aVar13.ptr;
  if (aVar13.length < 0xd) {
    pcVar9 = pcVar10;
  }
  if (vector == (Vector *)0x0) {
    puVar12 = &DAT_00000001;
  }
  else {
    lVar5 = 0;
    do {
      lVar11 = lVar5;
      cVar7 = input[lVar11] + 0xff;
      if (flip_bytes) {
        cVar7 = -2 - input[lVar11];
      }
      pcVar9[lVar11] = cVar7;
      lVar5 = lVar11 + 1;
    } while (vector != (Vector *)(lVar11 + 1));
    puVar12 = (undefined1 *)(lVar11 + 2);
  }
  uVar8 = (ulong)*puVar1;
  if (uVar8 < 0xd) {
    switchD_0105b559::default(pcVar10 + uVar8,0,0xc - uVar8);
  }
  else {
    puVar1[1] = **(uint **)(puVar1 + 2);
  }
  return (idx_t)puVar12;
}

Assistant:

static idx_t Decode(const_data_ptr_t input, Vector &result, idx_t result_idx, bool flip_bytes) {
		auto result_data = FlatVector::GetData<TYPE>(result);
		// iterate until we encounter the string delimiter to figure out the string length
		data_t string_delimiter = SortKeyVectorData::STRING_DELIMITER;
		if (flip_bytes) {
			string_delimiter = ~string_delimiter;
		}
		idx_t pos;
		for (pos = 0; input[pos] != string_delimiter; pos++) {
		}
		idx_t str_len = pos;
		// now allocate the string data and fill it with the decoded data
		result_data[result_idx] = StringVector::EmptyString(result, str_len);
		auto str_data = data_ptr_cast(result_data[result_idx].GetDataWriteable());
		for (pos = 0; pos < str_len; pos++) {
			if (flip_bytes) {
				str_data[pos] = (~input[pos]) - 1;
			} else {
				str_data[pos] = input[pos] - 1;
			}
		}
		result_data[result_idx].Finalize();
		return pos + 1;
	}